

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_file_writer.cpp
# Opt level: O2

void __thiscall
duckdb::BufferedFileWriter::WriteData
          (BufferedFileWriter *this,const_data_ptr_t buffer,idx_t write_size)

{
  FileSystem *pFVar1;
  ulong uVar2;
  type pFVar3;
  const_data_ptr_t pdVar4;
  ulong __n;
  idx_t iVar5;
  size_t __n_00;
  
  iVar5 = this->offset;
  if (write_size < 0x2000 - iVar5) {
    pdVar4 = buffer + write_size;
    while (buffer < pdVar4) {
      uVar2 = (long)pdVar4 - (long)buffer;
      __n = 0x1000 - this->offset;
      if (uVar2 < __n) {
        __n = uVar2;
      }
      switchD_00916250::default
                ((this->data).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + this->offset,buffer,
                 __n);
      buffer = buffer + __n;
      iVar5 = __n + this->offset;
      this->offset = iVar5;
      if (iVar5 == 0x1000) {
        Flush(this);
      }
    }
  }
  else {
    if (iVar5 == 0) {
      __n_00 = 0;
    }
    else {
      __n_00 = 0x1000 - iVar5;
      switchD_00916250::default
                ((this->data).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + iVar5,buffer,__n_00);
      this->offset = this->offset + __n_00;
      Flush(this);
    }
    pFVar1 = this->fs;
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*(&this->handle);
    (*pFVar1->_vptr_FileSystem[6])(pFVar1,pFVar3,buffer + __n_00,write_size - __n_00);
    this->total_written = this->total_written + (write_size - __n_00);
  }
  return;
}

Assistant:

void BufferedFileWriter::WriteData(const_data_ptr_t buffer, idx_t write_size) {
	if (write_size >= (2ULL * FILE_BUFFER_SIZE - offset)) {
		idx_t to_copy = 0;
		// Check before performing direct IO if there is some data in the current internal buffer.
		// If so, then fill the buffer (to avoid to small write operation), flush it and then write
		// all the remain data directly.
		// This is to avoid to split a large buffer into N*FILE_BUFFER_SIZE buffers
		if (offset != 0) {
			// Some data are still present in the buffer let write them before
			to_copy = FILE_BUFFER_SIZE - offset;
			memcpy(data.get() + offset, buffer, to_copy);
			offset += to_copy;
			Flush(); // Flush buffer before writing every things else
		}
		idx_t remaining_to_write = write_size - to_copy;
		fs.Write(*handle, const_cast<data_ptr_t>(buffer + to_copy), // NOLINT: wrong API in Write
		         UnsafeNumericCast<int64_t>(remaining_to_write));
		total_written += remaining_to_write;
	} else {
		// first copy anything we can from the buffer
		const_data_ptr_t end_ptr = buffer + write_size;
		while (buffer < end_ptr) {
			idx_t to_write = MinValue<idx_t>(UnsafeNumericCast<idx_t>((end_ptr - buffer)), FILE_BUFFER_SIZE - offset);
			D_ASSERT(to_write > 0);
			memcpy(data.get() + offset, buffer, to_write);
			offset += to_write;
			buffer += to_write;
			if (offset == FILE_BUFFER_SIZE) {
				Flush();
			}
		}
	}
}